

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O1

void __thiscall
asio::basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor>::
set_option<asio::detail::socket_option::boolean<1,2>>
          (basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor> *this,boolean<1,_2> *option)

{
  error_code __ec;
  error_code ec;
  error_code local_48;
  system_error local_38 [32];
  
  local_48._M_value = 0;
  local_48._M_cat = (error_category *)std::_V2::system_category();
  asio::detail::reactive_socket_service<asio::ip::tcp>::
  set_option<asio::detail::socket_option::boolean<1,2>>
            (*(reactive_socket_service<asio::ip::tcp> **)this,(implementation_type *)(this + 8),
             option,&local_48);
  __ec._4_4_ = 0;
  __ec._M_value = local_48._M_value;
  if (local_48._M_value != 0) {
    __ec._M_cat = local_48._M_cat;
    std::system_error::system_error(local_38,__ec,"set_option");
    asio::detail::throw_exception<std::system_error>(local_38);
    std::system_error::~system_error(local_38);
  }
  return;
}

Assistant:

void set_option(const SettableSocketOption& option)
  {
    asio::error_code ec;
    impl_.get_service().set_option(impl_.get_implementation(), option, ec);
    asio::detail::throw_error(ec, "set_option");
  }